

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_format_filter_by_ext.c
# Opt level: O0

void test_format_filter_by_ext
               (char *output_file,int format_id,int filter_id,int dot_stored,char *def_ext)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  void *buff_00;
  char *pcVar5;
  time_t tVar6;
  la_ssize_t v2;
  la_int64_t v2_00;
  long lVar7;
  char *filter_name;
  int r;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  archive_entry *ae;
  char *def_ext_local;
  int local_18;
  int dot_stored_local;
  int filter_id_local;
  int format_id_local;
  char *output_file_local;
  
  ae = (archive_entry *)def_ext;
  def_ext_local._4_4_ = dot_stored;
  local_18 = filter_id;
  dot_stored_local = format_id;
  _filter_id_local = output_file;
  buff_00 = malloc(0x100000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'(',(uint)(buff_00 != (void *)0x0),"(buff = malloc(buffsize)) != NULL",
                   (void *)0x0);
  if (buff_00 == (void *)0x0) {
    return;
  }
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'-',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  if (ae == (archive_entry *)0x0) {
    filter_name._4_4_ = archive_write_set_format_filter_by_ext((archive *)used,_filter_id_local);
  }
  else {
    filter_name._4_4_ =
         archive_write_set_format_filter_by_ext_def((archive *)used,_filter_id_local,(char *)ae);
  }
  if (filter_name._4_4_ == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'3');
    pcVar5 = archive_format_name((archive *)used);
    test_skipping("%s format not fully supported on this platform",pcVar5);
    iVar1 = archive_write_free((archive *)used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    free(buff_00);
    return;
  }
  if (filter_name._4_4_ == -0x1e) {
    pcVar5 = archive_error_string((archive *)used);
    iVar1 = strcmp(pcVar5,"lzma compression not supported on this platform");
    if (iVar1 != 0) {
      pcVar5 = archive_error_string((archive *)used);
      iVar1 = strcmp(pcVar5,"xz compression not supported on this platform");
      if (iVar1 != 0) goto LAB_0013b4e6;
    }
    pcVar5 = archive_filter_name((archive *)used,0);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'>');
    test_skipping("%s filter not supported on this platform",pcVar5);
    iVar1 = archive_write_free((archive *)used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                        ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    free(buff_00);
  }
  else {
LAB_0013b4e6:
    wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                                ,L'C',0,"ARCHIVE_OK",(long)filter_name._4_4_,"r",(void *)used);
    if (wVar2 == L'\0') {
      iVar1 = archive_write_free((archive *)used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'D',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(buff_00);
    }
    else {
      iVar1 = archive_write_open_memory((archive *)used,buff_00,0x100000,&buffsize);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'K',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
      a = (archive *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                       ,L'P',(uint)((archive_entry *)a != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_mtime((archive_entry *)a,1,0);
      tVar6 = archive_entry_mtime((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'R',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
      archive_entry_set_ctime((archive_entry *)a,1,0);
      tVar6 = archive_entry_ctime((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'T',1,"1",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
      archive_entry_set_atime((archive_entry *)a,1,0);
      tVar6 = archive_entry_atime((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'V',1,"1",tVar6,"archive_entry_atime(ae)",(void *)0x0);
      archive_entry_copy_pathname((archive_entry *)a,"file");
      pcVar5 = archive_entry_pathname((archive_entry *)a);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                 ,L'X',"file","\"file\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      archive_entry_set_mode((archive_entry *)a,0x81ed);
      mVar3 = archive_entry_mode((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'Z',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar3,"archive_entry_mode(ae)",
                          (void *)0x0);
      archive_entry_set_size((archive_entry *)a,8);
      iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\\',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
      archive_entry_free((archive_entry *)a);
      v2 = archive_write_data((archive *)used,"12345678",8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'^',8,"8",v2,"archive_write_data(a, \"12345678\", 8)",(void *)0x0);
      iVar1 = archive_write_close((archive *)used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'a',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
      iVar1 = archive_write_free((archive *)used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      if (0 < dot_stored_local) {
        used = (size_t)archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                         ,L'i',(uint)((archive *)used != (archive *)0x0),
                         "(a = archive_read_new()) != NULL",(void *)0x0);
        iVar1 = archive_read_support_format_all((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                            (void *)used);
        iVar1 = archive_read_support_filter_all((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                            (void *)used);
        iVar1 = read_open_memory_seek((archive *)used,buff_00,buffsize,7);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'o',0,"ARCHIVE_OK",(long)iVar1,
                            "read_open_memory_seek(a, buff, used, 7)",(void *)used);
        if ((def_ext_local._4_4_ & 1) != 0) {
          iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                              ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                              (void *)used);
          pcVar5 = archive_entry_pathname((archive_entry *)a);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                     ,L't',".","\".\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          mVar3 = archive_entry_filetype((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                              ,L'u',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                              (void *)0x0);
        }
        iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                            (void *)used);
        tVar6 = archive_entry_mtime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'{',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
        if ((def_ext_local._4_4_ & 2) == 0) {
          pcVar5 = archive_entry_pathname((archive_entry *)a);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                     ,L'\x7f',"file","\"file\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                     L'\0');
        }
        else {
          pcVar5 = archive_entry_pathname((archive_entry *)a);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                     ,L'}',"./file","\"./file\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                     L'\0');
        }
        mVar3 = archive_entry_filetype((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'\x81',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                            (void *)0x0);
        v2_00 = archive_entry_size((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'\x82',8,"8",v2_00,"archive_entry_size(ae)",(void *)0x0);
        iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'\x85',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                            (void *)used);
        lVar7 = (long)local_18;
        iVar1 = archive_filter_code((archive *)used,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'\x89',lVar7,"filter_id",(long)iVar1,"archive_filter_code(a, 0)",
                            (void *)used);
        lVar7 = (long)dot_stored_local;
        uVar4 = archive_format((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'\x8a',lVar7,"format_id",(long)(int)(uVar4 & 0xff0000),
                            "archive_format(a) & ARCHIVE_FORMAT_BASE_MASK",(void *)used);
        iVar1 = archive_read_close((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'\x8c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0)
        ;
        iVar1 = archive_read_free((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      }
      free(buff_00);
    }
  }
  return;
}

Assistant:

static void
test_format_filter_by_ext(const char *output_file, 
    int format_id, int filter_id, int dot_stored, const char * def_ext)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 1024;
	char *buff;
	int r;

	assert((buff = malloc(buffsize)) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	if( def_ext == NULL)
          r = archive_write_set_format_filter_by_ext(a, output_file);
        else
          r = archive_write_set_format_filter_by_ext_def(a, output_file, def_ext);
	if (r == ARCHIVE_WARN) {
		skipping("%s format not fully supported on this platform",
		   archive_format_name(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
        } else if (r == ARCHIVE_FATAL &&
	    (strcmp(archive_error_string(a),
		   "lzma compression not supported on this platform") == 0 ||
	     strcmp(archive_error_string(a),
		   "xz compression not supported on this platform") == 0)) {
                const char *filter_name = archive_filter_name(a, 0);
		skipping("%s filter not supported on this platform", filter_name);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	} else {
		if (!assertEqualIntA(a, ARCHIVE_OK, r)) {
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	}
        
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (format_id > 0) {
		/*
		 * Now, read the data back.
		 */
		/* With the test memory reader -- seeking mode. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    read_open_memory_seek(a, buff, used, 7));

		if (dot_stored & 1) {
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			assertEqualString(".", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
		}
		/*
		 * Read and verify the file.
		 */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(1, archive_entry_mtime(ae));
		if (dot_stored & 2) {
			assertEqualString("./file", archive_entry_pathname(ae));
		} else {
			assertEqualString("file", archive_entry_pathname(ae));
		}
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(8, archive_entry_size(ae));

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

		/* Verify archive format. */
		assertEqualIntA(a, filter_id,
		    archive_filter_code(a, 0));
		assertEqualIntA(a, format_id, archive_format(a) & ARCHIVE_FORMAT_BASE_MASK );

		assertEqualInt(ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff);
}